

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Runner::Runner(Runner *this,Config *config,Ptr<Catch::IReporter> *reporter)

{
  int iVar1;
  IMutableContext *pIVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  IReporter *pIVar3;
  Ptr<Catch::IReporter> *reporter_local;
  Config *config_local;
  Runner *this_local;
  
  IResultCapture::IResultCapture(&this->super_IResultCapture);
  IRunner::IRunner(&this->super_IRunner);
  (this->super_IResultCapture)._vptr_IResultCapture = (_func_int **)&PTR__Runner_0029e948;
  (this->super_IRunner)._vptr_IRunner = (_func_int **)&PTR__Runner_0029e9b0;
  pIVar2 = getCurrentMutableContext();
  this->m_context = pIVar2;
  this->m_runningTest = (RunningTest *)0x0;
  AssertionResult::AssertionResult(&this->m_lastResult);
  this->m_config = config;
  Totals::Totals(&this->m_totals);
  Ptr<Catch::IReporter>::Ptr(&this->m_reporter,reporter);
  std::vector<Catch::ScopedInfo_*,_std::allocator<Catch::ScopedInfo_*>_>::vector
            (&this->m_scopedInfos);
  std::vector<Catch::AssertionResult,_std::allocator<Catch::AssertionResult>_>::vector
            (&this->m_assertionResults);
  iVar1 = (*(this->m_context->super_IContext)._vptr_IContext[3])();
  this->m_prevRunner = (IRunner *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*(this->m_context->super_IContext)._vptr_IContext[2])();
  this->m_prevResultCapture = (IResultCapture *)CONCAT44(extraout_var_00,iVar1);
  iVar1 = (*(this->m_context->super_IContext)._vptr_IContext[6])();
  this->m_prevConfig = (IConfig *)CONCAT44(extraout_var_01,iVar1);
  AssertionInfo::AssertionInfo(&this->m_lastAssertionInfo);
  (*(this->m_context->super_IContext)._vptr_IContext[8])(this->m_context,&this->super_IRunner);
  (*(this->m_context->super_IContext)._vptr_IContext[9])(this->m_context,this->m_config);
  (*(this->m_context->super_IContext)._vptr_IContext[7])();
  pIVar3 = Ptr<Catch::IReporter>::operator->(&this->m_reporter);
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[5])();
  return;
}

Assistant:

explicit Runner( const Config& config, const Ptr<IReporter>& reporter )
        :   m_context( getCurrentMutableContext() ),
            m_runningTest( NULL ),
            m_config( config ),
            m_reporter( reporter ),
            m_prevRunner( &m_context.getRunner() ),
            m_prevResultCapture( &m_context.getResultCapture() ),
            m_prevConfig( m_context.getConfig() )
        {
            m_context.setRunner( this );
            m_context.setConfig( &m_config );
            m_context.setResultCapture( this );
            m_reporter->StartTesting();
        }